

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.cc
# Opt level: O1

fdb_status
wal_dur_snapshot_open
          (fdb_seqnum_t seqnum,_fdb_key_cmp_info *key_cmp_info,filemgr *file,fdb_txn *txn,
          snap_handle **shandle)

{
  list_elem *plVar1;
  fdb_custom_cmp_variable p_Var2;
  void *pvVar3;
  kvs_info *pkVar4;
  undefined7 uVar5;
  snap_handle *psVar6;
  fdb_seqnum_t fVar7;
  list_elem *e;
  fdb_kvs_id_t fVar8;
  list_elem *plVar9;
  fdb_status fVar10;
  
  if (seqnum == 0xffffffffffffffff) {
    fdb_assert_die("seqnum != FDB_SNAPSHOT_INMEM",
                   "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/wal.cc"
                   ,0x739,0xffffffffffffffff,(uint64_t)key_cmp_info->kvs);
  }
  if (key_cmp_info->kvs == (kvs_info *)0x0) {
    fVar8 = 0;
  }
  else {
    fVar8 = key_cmp_info->kvs->id;
  }
  psVar6 = (snap_handle *)calloc(1,0xe0);
  if (psVar6 == (snap_handle *)0x0) {
    psVar6 = (snap_handle *)0x0;
  }
  else {
    psVar6->id = fVar8;
    psVar6->snap_tag_idx = 0;
    psVar6->snap_stop_idx = 0;
    LOCK();
    (psVar6->ref_cnt_kvs).super___atomic_base<unsigned_short>._M_i = 0;
    UNLOCK();
    LOCK();
    (psVar6->wal_ndocs).super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
  }
  if (psVar6 == (snap_handle *)0x0) {
    fVar10 = FDB_RESULT_ALLOC_FAIL;
  }
  else {
    pthread_spin_lock(&file->wal->lock);
    psVar6->snap_txn = txn;
    uVar5 = *(undefined7 *)&(key_cmp_info->kvs_config).field_0x1;
    p_Var2 = (key_cmp_info->kvs_config).custom_cmp;
    pvVar3 = (key_cmp_info->kvs_config).custom_cmp_param;
    pkVar4 = key_cmp_info->kvs;
    (psVar6->cmp_info).kvs_config.create_if_missing = (key_cmp_info->kvs_config).create_if_missing;
    *(undefined7 *)&(psVar6->cmp_info).kvs_config.field_0x1 = uVar5;
    (psVar6->cmp_info).kvs_config.custom_cmp = p_Var2;
    (psVar6->cmp_info).kvs_config.custom_cmp_param = pvVar3;
    (psVar6->cmp_info).kvs = pkVar4;
    LOCK();
    (psVar6->ref_cnt_kvs).super___atomic_base<unsigned_short>._M_i =
         (psVar6->ref_cnt_kvs).super___atomic_base<unsigned_short>._M_i + 1;
    UNLOCK();
    _kvs_stat_get(file,psVar6->id,&psVar6->stat);
    if (seqnum == 0xffffffffffffffff) {
      fVar7 = fdb_kvs_get_seqnum(file,psVar6->id);
      psVar6->seqnum = fVar7;
    }
    else {
      (psVar6->stat).wal_ndocs = 0;
      (psVar6->stat).wal_ndeletes = 0;
      psVar6->seqnum = seqnum;
    }
    psVar6->is_persisted_snapshot = seqnum != 0xffffffffffffffff;
    avl_init(&psVar6->key_tree,&psVar6->cmp_info);
    fVar10 = FDB_RESULT_SUCCESS;
    avl_init(&psVar6->seq_tree,(void *)0x0);
    psVar6->global_txn = &file->global_txn;
    (psVar6->active_txn_list).head = (list_elem *)0x0;
    (psVar6->active_txn_list).tail = (list_elem *)0x0;
    plVar9 = (file->wal->txn_list).head;
    if (plVar9 != (list_elem *)0x0) {
      do {
        plVar1 = plVar9[1].prev;
        if ((fdb_txn *)plVar1 != &file->global_txn) {
          e = (list_elem *)calloc(1,0x18);
          e[1].prev = plVar1->next;
          list_push_front(&psVar6->active_txn_list,e);
        }
        plVar9 = plVar9->next;
      } while (plVar9 != (list_elem *)0x0);
    }
    pthread_spin_unlock(&file->wal->lock);
    *shandle = psVar6;
  }
  return fVar10;
}

Assistant:

fdb_status wal_dur_snapshot_open(fdb_seqnum_t seqnum,
                                 _fdb_key_cmp_info *key_cmp_info,
                                 struct filemgr *file, fdb_txn *txn,
                                 struct snap_handle **shandle)
{
    struct snap_handle *_shandle;
    fdb_kvs_id_t kv_id;
    fdb_assert(seqnum != FDB_SNAPSHOT_INMEM, seqnum, key_cmp_info->kvs);
    if (!key_cmp_info->kvs) {
        kv_id = 0;
    } else {
        kv_id = key_cmp_info->kvs->id;
    }
    _shandle = _wal_snapshot_create(kv_id, 0, 0);
    if (!_shandle) { // LCOV_EXCL_START
        return FDB_RESULT_ALLOC_FAIL;
    } // LCOV_EXCL_STOP
    spin_lock(&file->wal->lock);
    _wal_snapshot_init(_shandle, file, txn, seqnum, key_cmp_info);
    spin_unlock(&file->wal->lock);
    *shandle = _shandle;
    return FDB_RESULT_SUCCESS;
}